

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsu.c
# Opt level: O0

UINT8 device_start_vsu(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData;
  vsu_state *chip;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  devData.chipInf = calloc(1,0x210);
  if ((DEV_DATA *)devData.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    *(UINT32 *)&((DEV_DATA *)((long)devData.chipInf + 0x1f0))->chipInf = cfg->clock;
    *(uint *)((long)devData.chipInf + 500) =
         *(uint *)&((DEV_DATA *)((long)devData.chipInf + 0x1f0))->chipInf / 0x78;
    if ((cfg->srMode == '\x01') ||
       ((cfg->srMode == '\x02' && (*(uint *)((long)devData.chipInf + 500) < cfg->smplRate)))) {
      *(UINT32 *)((long)devData.chipInf + 500) = cfg->smplRate;
    }
    RC_SET_RATIO((RATIO_CNTR *)((long)devData.chipInf + 0x1f8),cfg->clock,
                 *(UINT32 *)((long)devData.chipInf + 500));
    vsu_set_mute_mask(devData.chipInf,0);
    *(void **)devData.chipInf = devData.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,*(UINT32 *)((long)devData.chipInf + 500),
                &devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_vsu(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	vsu_state* chip;
	
	chip = (vsu_state*)calloc(1, sizeof(vsu_state));
	if (chip == NULL)
		return 0xFF;
	
	chip->clock = cfg->clock;
	// sample rate according to https://github.com/emu-rs/rustual-boy/blob/master/rustual-boy-core/src/vsu/mod.rs
	// 20 MHz / 480 = 41.667 Hz, VGMs use 5 MHz / 120
	chip->smplrate = chip->clock / 120;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, chip->smplrate, cfg->smplRate);
	
	RC_SET_RATIO(&chip->cycleCntr, cfg->clock, chip->smplrate);
	
	vsu_set_mute_mask(chip, 0x00);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, chip->smplrate, &devDef);
	
	return 0x00;
}